

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

RegOpnd * Lowerer::LoadGeneratorArgsPtr(Instr *instrInsert)

{
  code *pcVar1;
  OpndKind OVar2;
  bool bVar3;
  Instr *pIVar4;
  undefined4 *puVar5;
  IndirOpnd *src;
  RegOpnd *pRVar6;
  
  pIVar4 = LoadGeneratorObject(instrInsert);
  pRVar6 = (RegOpnd *)pIVar4->m_dst;
  OVar2 = IR::Opnd::GetKind((Opnd *)pRVar6);
  if (OVar2 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  src = IR::IndirOpnd::New(pRVar6,0x38,TyUint64,instrInsert->m_func,false);
  pRVar6 = IR::RegOpnd::New(TyInt64,instrInsert->m_func);
  InsertMove(&pRVar6->super_Opnd,&src->super_Opnd,instrInsert,true);
  return pRVar6;
}

Assistant:

IR::RegOpnd *
Lowerer::LoadGeneratorArgsPtr(IR::Instr *instrInsert)
{
    IR::Instr * instr = LoadGeneratorObject(instrInsert);
    IR::RegOpnd * generatorRegOpnd = instr->GetDst()->AsRegOpnd();

    IR::IndirOpnd * indirOpnd = IR::IndirOpnd::New(generatorRegOpnd, Js::JavascriptGenerator::GetArgsPtrOffset(), TyMachPtr, instrInsert->m_func);
    IR::RegOpnd * argsPtrOpnd = IR::RegOpnd::New(TyMachReg, instrInsert->m_func);
    Lowerer::InsertMove(argsPtrOpnd, indirOpnd, instrInsert);
    return argsPtrOpnd;
}